

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memzero_s.c
# Opt level: O1

errno_t memzero_s(void *dest,rsize_t len)

{
  long lVar1;
  errno_t error;
  errno_t eVar2;
  char *msg;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (void *)0x0) {
    msg = "memzero_s: dest is null";
    eVar2 = 400;
    error = 400;
  }
  else if (len == 0) {
    msg = "memzero_s: len is 0";
    eVar2 = 0x191;
    error = 0x191;
  }
  else {
    if (len < 0x10000001) {
      eVar2 = 0;
      mem_prim_set(dest,(uint32_t)len,'\0');
      goto LAB_00103c00;
    }
    msg = "memzero_s: len exceeds max";
    eVar2 = 0x193;
    error = 0x193;
  }
  invoke_safe_mem_constraint_handler(msg,(void *)0x0,error);
LAB_00103c00:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return eVar2;
  }
  __stack_chk_fail();
}

Assistant:

errno_t
memzero_s (void *dest, rsize_t len)
{
    if (dest == NULL) {
        invoke_safe_mem_constraint_handler("memzero_s: dest is null",
                   NULL, ESNULLP);
        return (RCNEGATE(ESNULLP));
    }

    if (len == 0) {
        invoke_safe_mem_constraint_handler("memzero_s: len is 0",
                   NULL, ESZEROL);
        return (RCNEGATE(ESZEROL));
    }

    if (len > RSIZE_MAX_MEM) {
        invoke_safe_mem_constraint_handler("memzero_s: len exceeds max",
                   NULL, ESLEMAX);
        return (RCNEGATE(ESLEMAX));
    }

    /*
     * mem_prim_set(dest, len, 0xA5);
     * mem_prim_set(dest, len, 0x5A);
     */
    mem_prim_set(dest, len, 0);

    return (RCNEGATE(EOK));
}